

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.cpp
# Opt level: O1

void __thiscall
pzgeom::TPZArc3D::ComputeR2Points
          (TPZArc3D *this,TPZFMatrix<double> *coord,double *xa,double *ya,double *xb,double *yb)

{
  long lVar1;
  TPZFMatrix<double> *coord_00;
  TPZArc3D *this_00;
  long lVar2;
  double dVar3;
  TPZManVector<double,_3> Temp;
  TPZManVector<double,_3> Axe;
  TPZSavable local_a8;
  undefined1 local_a0 [64];
  double *local_60;
  
  local_a0._0_8_ = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)(local_a0 + 0x38),3,(double *)local_a0);
  local_a8._vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_a0,3,(double *)&local_a8);
  lVar2 = 0;
  while( true ) {
    if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
       ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
       ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) break;
    local_60[lVar2] =
         coord->fElem[lVar2] -
         coord->fElem[(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + lVar2];
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      lVar2 = 0;
      do {
        lVar1 = 0;
        do {
          if (((this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
               .fRow <= lVar2) ||
             ((this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fCol <= lVar1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(double *)(local_a0._8_8_ + lVar2 * 8) =
               (this->fICnBase).super_TPZFMatrix<double>.fElem
               [(this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                super_TPZBaseMatrix.fRow * lVar1 + lVar2] * local_60[lVar1] +
               *(double *)(local_a0._8_8_ + lVar2 * 8);
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      this_00 = (TPZArc3D *)local_a0;
      *xa = *(double *)local_a0._8_8_;
      *ya = *(double *)(local_a0._8_8_ + 8);
      coord_00 = (TPZFMatrix<double> *)&local_a8;
      local_a8._vptr_TPZSavable = (_func_int **)0x0;
      TPZVec<double>::Fill((TPZVec<double> *)this_00,(double *)coord_00,0,-1);
      lVar2 = 0;
      while( true ) {
        if (((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar2) ||
           ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar2) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3))
        break;
        local_60[lVar2] =
             coord->fElem[lVar1 + lVar2] -
             coord->fElem[(coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + lVar2];
        lVar2 = lVar2 + 1;
        if (lVar2 == 3) {
          lVar2 = 0;
          do {
            lVar1 = 0;
            do {
              if (((this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow <= lVar2) ||
                 ((this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fCol <= lVar1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(double *)(local_a0._8_8_ + lVar2 * 8) =
                   (this->fICnBase).super_TPZFMatrix<double>.fElem
                   [(this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fRow * lVar1 + lVar2] * local_60[lVar1] +
                   *(double *)(local_a0._8_8_ + lVar2 * 8);
              lVar1 = lVar1 + 1;
            } while (lVar1 != 3);
            lVar2 = lVar2 + 1;
            if (lVar2 == 3) {
              *xb = *(double *)local_a0._8_8_;
              dVar3 = *(double *)(local_a0._8_8_ + 8);
              *yb = dVar3;
              dVar3 = ArcAngle(this_00,coord_00,*xa,*ya,*xb,dVar3);
              this->fAngle = dVar3;
              TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_a0);
              TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)(local_a0 + 0x38));
              return;
            }
          } while( true );
        }
      }
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZArc3D::ComputeR2Points(TPZFMatrix<REAL> &coord, double &xa, double &ya, double &xb, double &yb)
{
	/** vector (ini - middle) written in new R2 base */
	TPZManVector<REAL,3> Axe(3,0.), Temp(3,0.);
	int i, j;
	for(i = 0; i < 3; i++) Axe[i] = coord(i,0) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xa = Temp[0]; ya = Temp[1];
	Temp.Fill(0.);
	
	/** vector (final - middle) written in new R2 base */
	for(i = 0; i < 3; i++) Axe[i] = coord(i,1) - coord(i,2);
	for(i = 0; i < 3; i++)
	{
		for(j = 0; j < 3; j++) Temp[i] += fICnBase(i,j)*Axe[j];
	}
	xb = Temp[0]; yb = Temp[1];
	
	fAngle = ArcAngle(coord,xa, ya, xb, yb);
}